

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  undefined7 uVar5;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  int extraout_EDX;
  undefined8 uVar6;
  char *unaff_R12;
  string *unaff_R15;
  string parquetOutFile;
  string subFolder;
  sigaction sa;
  allocator local_159;
  undefined8 local_158;
  undefined8 local_150;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  sigaction local_c8;
  
  progname = *argv;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_150 = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_158 = 0;
LAB_001038a6:
  do {
    iVar4 = getopt(argc,argv,"osvhK:p:");
    pcVar3 = _optarg;
    uVar5 = (undefined7)
            ((ulong)((long)&switchD_001038c6::switchdataD_00105184 +
                    (long)(int)(&switchD_001038c6::switchdataD_00105184)[iVar4 - 0x6f]) >> 8);
    switch(iVar4) {
    case 0x6f:
      local_158 = CONCAT71(uVar5,1);
      goto LAB_001038a6;
    case 0x70:
      unaff_R15 = &local_108;
      break;
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
switchD_001038c6_caseD_71:
      main_cold_5();
      goto switchD_001038c6_caseD_76;
    case 0x73:
      goto switchD_001038c6_caseD_73;
    case 0x76:
      goto switchD_001038c6_caseD_76;
    default:
      unaff_R15 = &local_e8;
      if (iVar4 != 0x4b) {
        if (iVar4 == -1) {
          if (local_e8._M_string_length == 0) goto LAB_00103ad3;
          if (local_108._M_string_length == 0) {
            memset(&local_c8,0,0x98);
            sigemptyset(&local_c8.sa_mask);
            local_c8.__sigaction_handler.sa_handler = segfault_sigaction;
            local_c8.sa_flags = 4;
            sigaction(0xb,&local_c8,(sigaction *)0x0);
            std::__cxx11::string::string((string *)&local_128,progname,&local_159);
            paVar1 = &local_148.field_2;
            local_148._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"INFO","");
            logprintf(&local_128,&local_148,"starting process..\n");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar1) {
              operator_delete(local_148._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p);
            }
            aalcalcmeanonly::DoIt
                      (&local_e8,(bool)((byte)local_150 & 1),(bool)((byte)local_158 & 1),&local_108)
            ;
            std::__cxx11::string::string((string *)&local_128,progname,&local_159);
            local_148._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"INFO","");
            logprintf(&local_128,&local_148,"finishing process..\n");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar1) {
              operator_delete(local_148._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p);
            }
            return 0;
          }
          goto LAB_00103ad8;
        }
        goto switchD_001038c6_caseD_71;
      }
    }
    pcVar2 = (char *)unaff_R15->_M_string_length;
    strlen(_optarg);
    std::__cxx11::string::_M_replace((ulong)unaff_R15,0,pcVar2,(ulong)pcVar3);
    unaff_R12 = pcVar3;
  } while( true );
switchD_001038c6_caseD_73:
  local_150 = CONCAT71(uVar5,1);
  goto LAB_001038a6;
switchD_001038c6_caseD_76:
  main_cold_1();
LAB_00103ad3:
  main_cold_4();
LAB_00103ad8:
  main_cold_2();
  if ((string *)local_148._M_dataplus._M_p != unaff_R15) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if (local_128._M_dataplus._M_p != unaff_R12) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  uVar6 = extraout_RAX;
  if (extraout_EDX == 1) {
    main_cold_3();
    uVar6 = extraout_RAX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

int main(int argc, char* argv[]) {

  progname = argv[0];
  std::string subFolder;
  int opt;
  bool skipHeader = false;
  bool ordOutput = false;
  std::string parquetOutFile;

  while ((opt = getopt(argc, argv, (char *)"osvhK:p:")) != -1) {
    switch (opt) {
      case 'v':
#ifdef HAVE_PARQUET
        fprintf(stderr, "%s : version: %s : Parquet output enabled\n",
                argv[0], VERSION);
#else
        fprintf(stderr, "%s: version: %s\n", argv[0], VERSION);
#endif
	exit(EXIT_FAILURE);
      case 's':
        skipHeader = true;
        break;
      case 'o':
        ordOutput = true;
        break;
      case 'K':
        subFolder = optarg;
        break;
      case 'p':
        parquetOutFile = optarg;
	break;
      case 'h':
      default:
	help();
	exit(EXIT_FAILURE);
    }
  }

  if (subFolder.length() == 0) {
    fprintf(stderr, "FATAL: No folder supplied for summarycalc files\n");
    exit(EXIT_FAILURE);
  }

#ifndef HAVE_PARQUET
  if (!parquetOutFile.empty()) {
    fprintf(stderr, "FATAL: Apache arrow libraries for parquet output are missing.\n"
                    "Please install libraries and recompile to use this option.\n");
    exit(EXIT_FAILURE);
  }
#endif

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = segfault_sigaction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {
    logprintf(progname, "INFO", "starting process..\n");
    aalcalcmeanonly::DoIt(subFolder, skipHeader, ordOutput, parquetOutFile);
    logprintf(progname, "INFO", "finishing process..\n");
  } catch (std::bad_alloc&) {
    fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
    exit(EXIT_FAILURE);
  }

  return EXIT_SUCCESS;

}